

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O0

bool __thiscall
despot::LaserTag::Step
          (LaserTag *this,State *state,double random_num,ACT_TYPE action,double *reward,
          OBS_TYPE *obs)

{
  int iVar1;
  const_reference pvVar2;
  const_reference this_00;
  const_reference pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  double random_num_00;
  int local_5c;
  double dStack_58;
  int reading;
  double mass;
  int dir;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *distribution;
  bool terminal;
  Random random;
  OBS_TYPE *pOStack_38;
  OBS_TYPE *obs_local;
  double *reward_local;
  ACT_TYPE action_local;
  double random_num_local;
  State *state_local;
  LaserTag *this_local;
  
  pOStack_38 = obs;
  despot::Random::Random((Random *)((long)&distribution + 4),random_num);
  random_num_00 = (double)despot::Random::NextDouble();
  distribution._3_1_ = BaseTag::Step(&this->super_BaseTag,state,random_num_00,action,reward);
  if ((bool)distribution._3_1_) {
    *pOStack_38 = (this->super_BaseTag).same_loc_obs_;
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_BaseTag).rob_,(long)*(int *)(state + 0xc));
    iVar1 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_BaseTag).opp_,(long)*(int *)(state + 0xc));
    if (iVar1 == *pvVar2) {
      *pOStack_38 = (this->super_BaseTag).same_loc_obs_;
    }
    else {
      this_00 = std::
                vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                ::operator[](&this->reading_distributions_,(long)*(int *)(state + 0xc));
      *pOStack_38 = 0;
      for (mass._4_4_ = 0; mass._4_4_ < NBEAMS; mass._4_4_ = mass._4_4_ + 1) {
        dStack_58 = (double)despot::Random::NextDouble();
        local_5c = 0;
        while( true ) {
          pvVar3 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](this_00,(long)mass._4_4_);
          sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
          if (sVar4 <= (ulong)(long)local_5c) break;
          pvVar3 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](this_00,(long)mass._4_4_);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_5c);
          dStack_58 = dStack_58 - *pvVar5;
          if (dStack_58 < Globals::TINY) break;
          local_5c = local_5c + 1;
        }
        SetReading(pOStack_38,(long)local_5c,(long)mass._4_4_);
      }
    }
  }
  return (bool)(distribution._3_1_ & 1);
}

Assistant:

bool LaserTag::Step(State& state, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	Random random(random_num);
	bool terminal = BaseTag::Step(state, random.NextDouble(), action, reward);

	if (terminal) {
		obs = same_loc_obs_;
	} else {
		if (rob_[state.state_id] == opp_[state.state_id])
			obs = same_loc_obs_;
		else {
			const vector<vector<double> >& distribution = reading_distributions_[state.state_id];

			obs = 0;
			for (int dir = 0; dir < NBEAMS; dir++) {
				double mass = random.NextDouble();
				int reading = 0;
				for (; reading < distribution[dir].size(); reading++) {
					mass -= distribution[dir][reading];
					if (mass < Globals::TINY)
						break;
				}
				SetReading(obs, reading, dir);
			}
		}
	}

	return terminal;
}